

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::new_incumbent
          (Proof *this,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *solution)

{
  bool bVar1;
  type pbVar2;
  mapped_type *pmVar3;
  pointer pIVar4;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  key_type *__k;
  ostream *poVar5;
  mapped_type *pmVar6;
  long lVar7;
  undefined8 in_RSI;
  char *pcVar8;
  type_conflict2 *w;
  type_conflict2 *v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1_1;
  type *t;
  type *v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *__range1;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *in_stack_ffffffffffffff48;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff50;
  pair<int,_int> local_90;
  pair<long,_long> local_88;
  key_type_conflict *in_stack_ffffffffffffff88;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_58;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_50;
  long local_48;
  type_conflict4 *local_40;
  int *local_38;
  reference local_30;
  pair<int,_bool> *local_28;
  __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
  local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x140949);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_ffffffffffffff50);
  std::operator<<(pbVar2,"soli");
  local_18 = local_10;
  local_20._M_current =
       (pair<int,_bool> *)
       std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::begin
                 (in_stack_ffffffffffffff48);
  local_28 = (pair<int,_bool> *)
             std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::end
                       (in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
               ::operator*(&local_20);
    local_38 = std::get<0ul,int,bool>((pair<int,_bool> *)0x1409e3);
    local_40 = std::get<1ul,int,bool>((pair<int,_bool> *)0x1409f8);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x140a07);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffff50);
    poVar5 = std::operator<<(pbVar2," ");
    pcVar8 = "~";
    if ((*local_40 & 1U) != 0) {
      pcVar8 = "";
    }
    poVar5 = std::operator<<(poVar5,pcVar8);
    poVar5 = std::operator<<(poVar5,"x");
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x140a67);
    local_48 = (long)*local_38;
    pmVar3 = std::
             map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::operator<<(poVar5,(string *)pmVar3);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
    ::operator++(&local_20);
  }
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x140ab4);
  local_50 = &pIVar4->zero_in_proof_objectives;
  local_58._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  in_stack_ffffffffffffff48);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator*(&local_58);
    this_00 = (map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)std::get<0ul,int,int>((pair<int,_int> *)0x140b10);
    __k = (key_type *)std::get<1ul,int,int>((pair<int,_int> *)0x140b1f);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x140b2e);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffff50);
    poVar5 = std::operator<<(pbVar2," ~");
    poVar5 = std::operator<<(poVar5,"x");
    pIVar4 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x140b6a);
    in_stack_ffffffffffffff50 = &pIVar4->variable_mappings;
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_90,(int *)this_00,(int *)__k);
    std::pair<long,_long>::pair<int,_int,_true>(&local_88,&local_90);
    pmVar6 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,__k);
    std::operator<<(poVar5,(string *)pmVar6);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_58);
  }
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x140bcd);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_ffffffffffffff50);
  std::operator<<(pbVar2,'\n');
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x140bf3);
  lVar7 = pIVar4->proof_line + 1;
  pIVar4->proof_line = lVar7;
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x140c13);
  pIVar4->objective_line = lVar7;
  return;
}

Assistant:

auto Proof::new_incumbent(const vector<pair<int, bool>> & solution) -> void
{
    *_imp->proof_stream << "soli";
    for (auto & [v, t] : solution)
        *_imp->proof_stream << " " << (t ? "" : "~") << "x" << _imp->binary_variable_mappings[v];
    for (auto & [v, w] : _imp->zero_in_proof_objectives)
        *_imp->proof_stream << " ~"
                            << "x" << _imp->variable_mappings[pair{v, w}];
    *_imp->proof_stream << '\n';
    _imp->objective_line = ++_imp->proof_line;
}